

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
fasttext::Model::initTableNegatives(Model *this,vector<long,_std::allocator<long>_> *counts)

{
  undefined1 auVar1 [16];
  vector<int,_std::allocator<int>_> *pvVar2;
  const_reference pvVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  vector<long,_std::allocator<long>_> *in_RSI;
  float fVar5;
  double dVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  size_t j;
  real c;
  size_t i_1;
  size_t i;
  linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *in_stack_00000050;
  real z;
  vector<int,_std::allocator<int>_> *this_00;
  long local_38;
  vector<int,_std::allocator<int>_> *local_28;
  vector<int,_std::allocator<int>_> *local_20;
  float local_14;
  undefined1 extraout_var [56];
  
  local_14 = 0.0;
  local_20 = (vector<int,_std::allocator<int>_> *)0x0;
  while( true ) {
    this_00 = local_20;
    pvVar2 = (vector<int,_std::allocator<int>_> *)
             std::vector<long,_std::allocator<long>_>::size(in_RSI);
    if (pvVar2 <= this_00) break;
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](in_RSI,(size_type)local_20);
    dVar6 = pow((double)*pvVar3,0.5);
    local_14 = (float)((double)local_14 + dVar6);
    local_20 = (vector<int,_std::allocator<int>_> *)
               ((long)&(local_20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1);
  }
  local_28 = (vector<int,_std::allocator<int>_> *)0x0;
  while( true ) {
    pvVar2 = local_28;
    pvVar4 = (vector<int,_std::allocator<int>_> *)
             std::vector<long,_std::allocator<long>_>::size(in_RSI);
    if (pvVar4 <= pvVar2) break;
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](in_RSI,(size_type)local_28);
    auVar7._0_8_ = pow((double)*pvVar3,0.5);
    auVar7._8_56_ = extraout_var;
    auVar8 = ZEXT1664(CONCAT124(auVar7._4_12_,(float)auVar7._0_8_));
    local_38 = 0;
    while( true ) {
      auVar1 = vcvtusi2ss_avx512f(auVar8._0_16_,local_38);
      fVar5 = ((float)auVar7._0_8_ * 1e+07) / local_14;
      auVar8 = ZEXT1664(CONCAT124(SUB6012((undefined1  [60])0x0,0),fVar5));
      if (fVar5 <= auVar1._0_4_) break;
      std::vector<int,_std::allocator<int>_>::push_back(this_00,(value_type_conflict *)pvVar2);
      local_38 = local_38 + 1;
    }
    local_28 = (vector<int,_std::allocator<int>_> *)
               ((long)&(local_28->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + 1);
  }
  std::vector<int,_std::allocator<int>_>::begin(pvVar2);
  std::vector<int,_std::allocator<int>_>::end(pvVar2);
  std::
  shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>&>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)counts,
             in_stack_00000050);
  return;
}

Assistant:

void Model::initTableNegatives(const std::vector<int64_t>& counts) {
  real z = 0.0;
  for (size_t i = 0; i < counts.size(); i++) {
    z += pow(counts[i], 0.5);
  }
  for (size_t i = 0; i < counts.size(); i++) {
    real c = pow(counts[i], 0.5);
    for (size_t j = 0; j < c * NEGATIVE_TABLE_SIZE / z; j++) {
      negatives_.push_back(i);
    }
  }
  std::shuffle(negatives_.begin(), negatives_.end(), rng);
}